

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result * __thiscall
testing::internal::FunctionMocker<ot::commissioner::Error_()>::PerformDefaultAction
          (Result *__return_storage_ptr__,FunctionMocker<ot::commissioner::Error_()> *this,
          ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  OnCallSpec<ot::commissioner::Error_()> *this_00;
  Action<ot::commissioner::Error_()> *pAVar2;
  string message;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<ot::commissioner::Error_()> *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_38);
    if (DefaultValue<ot::commissioner::Error>::producer_ == (long *)0x0) {
      __return_storage_ptr__->mCode = kNone;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      (__return_storage_ptr__->mMessage)._M_string_length = 0;
      (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
    }
    else {
      (**(code **)(*DefaultValue<ot::commissioner::Error>::producer_ + 0x10))
                (__return_storage_ptr__);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  else {
    pAVar2 = OnCallSpec<ot::commissioner::Error_()>::GetAction(this_00);
    Action<ot::commissioner::Error_()>::Perform(__return_storage_ptr__,pAVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }